

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

Kit_Graph_t * Kit_GraphCreate(int nLeaves)

{
  Kit_Graph_t *__s;
  Kit_Node_t *pKVar1;
  Kit_Graph_t *pGraph;
  int nLeaves_local;
  
  __s = (Kit_Graph_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->nLeaves = nLeaves;
  __s->nSize = nLeaves;
  __s->nCap = nLeaves * 2 + 0x32;
  pKVar1 = (Kit_Node_t *)malloc((long)__s->nCap * 0x18);
  __s->pNodes = pKVar1;
  memset(__s->pNodes,0,(long)__s->nSize * 0x18);
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates a graph with the given number of leaves.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_Graph_t * Kit_GraphCreate( int nLeaves )   
{
    Kit_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Kit_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Kit_Graph_t) );
    pGraph->nLeaves = nLeaves;
    pGraph->nSize = nLeaves;
    pGraph->nCap = 2 * nLeaves + 50;
    pGraph->pNodes = ABC_ALLOC( Kit_Node_t, pGraph->nCap );
    memset( pGraph->pNodes, 0, sizeof(Kit_Node_t) * pGraph->nSize );
    return pGraph;
}